

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.cpp
# Opt level: O0

void __thiscall channel::~channel(channel *this)

{
  LogMessage *pLVar1;
  Log local_50;
  channel *local_10;
  channel *this_local;
  
  this->_vptr_channel = (_func_int **)&PTR__channel_00141ad8;
  local_10 = this;
  close(this->fd);
  Log::Log(&local_50,0x2c,
           "/workspace/llm4binary/github/license_all_cmakelists_25/MR-Wuhaha[P]WebServer/channel.cpp"
          );
  pLVar1 = Log::PutMessage(&local_50);
  pLVar1 = LogMessage::operator<<(pLVar1,"client fd: ");
  pLVar1 = LogMessage::operator<<(pLVar1,this->fd);
  LogMessage::operator<<(pLVar1," has been closed");
  Log::~Log(&local_50);
  if (this->read_buff != (char *)0x0) {
    operator_delete__(this->read_buff);
  }
  if (this->write_buff != (char *)0x0) {
    operator_delete__(this->write_buff);
  }
  std::weak_ptr<TimeRoundItem<channel>_>::~weak_ptr(&this->wp_time_round_item);
  std::enable_shared_from_this<channel>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<channel>);
  return;
}

Assistant:

channel::~channel()
{
    close(fd);
    LOG <<"client fd: "<<fd<<" has been closed";
    delete[] read_buff;
    delete[] write_buff;
}